

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall RVO::Agent::computeNeighbors(Agent *this)

{
  pointer ppOVar1;
  pointer ppVar2;
  
  ppOVar1 = (this->obstacleNeighbors_).
            super__Vector_base<const_RVO::Obstacle_*,_std::allocator<const_RVO::Obstacle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->obstacleNeighbors_).
      super__Vector_base<const_RVO::Obstacle_*,_std::allocator<const_RVO::Obstacle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar1) {
    (this->obstacleNeighbors_).
    super__Vector_base<const_RVO::Obstacle_*,_std::allocator<const_RVO::Obstacle_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppOVar1;
  }
  KdTree::computeObstacleNeighbors
            (this->sim_->kdTree_,this,this->neighborObstDist_ * this->neighborObstDist_);
  ppVar2 = (this->agentNeighbors_).
           super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->agentNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->agentNeighbors_).
    super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  if (this->maxNeighbors_ != 0) {
    KdTree::computeAgentNeighbors
              (this->sim_->kdTree_,this,this->neighborDist_ * this->neighborDist_);
    return;
  }
  return;
}

Assistant:

void Agent::computeNeighbors()
	{
		obstacleNeighbors_.clear();
		sim_->kdTree_->computeObstacleNeighbors(this, neighborObstDist_ * neighborObstDist_);

		agentNeighbors_.clear();

		if (maxNeighbors_ > 0) {
			sim_->kdTree_->computeAgentNeighbors(this, neighborDist_ * neighborDist_);
		}
	}